

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

WalletBalances * __thiscall wallet::anon_unknown_5::WalletImpl::getBalances(WalletImpl *this)

{
  long lVar1;
  byte bVar2;
  long *in_RSI;
  WalletBalances *in_RDI;
  long in_FS_OFFSET;
  Balance bal;
  WalletBalances *pWVar3;
  CAmount local_38;
  CAmount local_30;
  CAmount local_28;
  CAmount local_20;
  CAmount local_18;
  CAmount local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar3 = in_RDI;
  _GLOBAL__N_1::std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              in_RDI);
  GetBalance((CWallet *)bal.m_watchonly_trusted,bal.m_mine_immature._4_4_,bal.m_mine_immature._3_1_)
  ;
  interfaces::WalletBalances::WalletBalances(in_RDI);
  pWVar3->balance = local_38;
  pWVar3->unconfirmed_balance = local_30;
  pWVar3->immature_balance = local_28;
  bVar2 = (**(code **)(*in_RSI + 0x78))();
  pWVar3->have_watch_only = (bool)(bVar2 & 1);
  if ((pWVar3->have_watch_only & 1U) != 0) {
    pWVar3->watch_only_balance = local_20;
    pWVar3->unconfirmed_watch_only_balance = local_18;
    pWVar3->immature_watch_only_balance = local_10;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

WalletBalances getBalances() override
    {
        const auto bal = GetBalance(*m_wallet);
        WalletBalances result;
        result.balance = bal.m_mine_trusted;
        result.unconfirmed_balance = bal.m_mine_untrusted_pending;
        result.immature_balance = bal.m_mine_immature;
        result.have_watch_only = haveWatchOnly();
        if (result.have_watch_only) {
            result.watch_only_balance = bal.m_watchonly_trusted;
            result.unconfirmed_watch_only_balance = bal.m_watchonly_untrusted_pending;
            result.immature_watch_only_balance = bal.m_watchonly_immature;
        }
        return result;
    }